

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

ValuedAction __thiscall despot::Parser::ComputeMaxRewardAction(Parser *this)

{
  pointer pNVar1;
  ulong uVar2;
  ulong uVar3;
  pointer pFVar4;
  long lVar5;
  ACT_TYPE _action;
  double _value;
  double dVar6;
  ValuedAction VVar7;
  ValuedAction max;
  ValuedAction local_58;
  ValuedAction local_40;
  
  ValuedAction::ValuedAction(&local_58,-1,-INFINITY);
  pNVar1 = (this->action_vars_).
           super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)*(pointer *)
                               ((long)&(pNVar1->super_Variable).values_.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               + 8) -
                       *(long *)&(pNVar1->super_Variable).values_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data) >> 5)) {
    _action = 0;
    do {
      pFVar4 = (this->reward_funcs_).
               super__Vector_base<despot::Function,_std::allocator<despot::Function>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->reward_funcs_).
          super__Vector_base<despot::Function,_std::allocator<despot::Function>_>._M_impl.
          super__Vector_impl_data._M_finish == pFVar4) {
        _value = 0.0;
      }
      else {
        _value = 0.0;
        lVar5 = 0;
        uVar3 = 0;
        do {
          dVar6 = (double)(**(code **)(*(long *)((long)&pFVar4->_vptr_Function + lVar5) + 0x50))
                                    ((long)&pFVar4->_vptr_Function + lVar5,
                                     (this->action_vars_).
                                     super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
                                     ._M_impl.super__Vector_impl_data._M_start,_action);
          _value = _value + dVar6;
          uVar3 = uVar3 + 1;
          pFVar4 = (this->reward_funcs_).
                   super__Vector_base<despot::Function,_std::allocator<despot::Function>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar2 = ((long)(this->reward_funcs_).
                         super__Vector_base<despot::Function,_std::allocator<despot::Function>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)pFVar4 >> 3) *
                  0x2e8ba2e8ba2e8ba3;
          lVar5 = lVar5 + 0x58;
        } while (uVar3 <= uVar2 && uVar2 - uVar3 != 0);
      }
      if (local_58.value < _value) {
        ValuedAction::ValuedAction(&local_40,_action,_value);
        local_58.action = local_40.action;
        local_58._4_4_ = local_40._4_4_;
        local_58.value = local_40.value;
      }
      _action = _action + 1;
      pNVar1 = (this->action_vars_).
               super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (_action < (int)((ulong)((long)*(pointer *)
                                            ((long)&(pNVar1->super_Variable).values_.
                                                                                                        
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            + 8) -
                                    *(long *)&(pNVar1->super_Variable).values_.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data) >> 5));
  }
  VVar7._0_8_ = local_58._0_8_ & 0xffffffff;
  VVar7.value = local_58.value;
  return VVar7;
}

Assistant:

ValuedAction Parser::ComputeMaxRewardAction() const {
	ValuedAction max(-1, Globals::NEG_INFTY);
	for (int a = 0; a < action_vars_[0].Size(); a++) {
		double reward = 0;
		for (int r = 0; r < reward_funcs_.size(); r++) {
			reward += reward_funcs_[r].ComputeConstrainedMaximum(
				&action_vars_[0], a);
		}
		if (reward > max.value) {
			max = ValuedAction(a, reward);
		}
	}
	return max;
}